

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O0

void anon_unknown.dwarf_24c551::writeReadRGBAMIP
               (char *fileName,int width,int height,RgbaChannels channels,Compression comp,int xSize
               ,int ySize)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  RgbaChannels RVar6;
  ostream *poVar7;
  void *pvVar8;
  undefined4 *puVar9;
  int *piVar10;
  Array2D<Imf_3_4::Rgba> *pAVar11;
  Rgba *pRVar12;
  float *pfVar13;
  Vec2<float> *v;
  RgbaChannels in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar14;
  float fVar15;
  int in_stack_00000008;
  int x;
  int y;
  int l;
  int levelHeight_1;
  int levelWidth_1;
  int level_1;
  Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> levels2;
  int numLevels_1;
  int dwy;
  int dwx;
  Box2i *dw;
  TiledRgbaInputFile in;
  int levelHeight;
  int levelWidth;
  int level;
  int numLevels;
  TiledRgbaOutputFile out;
  Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> levels;
  Header header;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffcd4;
  int in_stack_fffffffffffffcdc;
  Array2D<Imf_3_4::Rgba> *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf4;
  long in_stack_fffffffffffffd20;
  long in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  long in_stack_fffffffffffffd58;
  Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *in_stack_fffffffffffffd60;
  int local_128;
  int local_124;
  int local_120;
  Vec2<float> local_11c;
  undefined4 local_114;
  undefined4 local_110;
  int local_10c;
  Array local_108 [20];
  int local_f4;
  int local_f0;
  int local_ec;
  int *local_e8;
  Rgba local_e0 [7];
  undefined4 local_a8;
  undefined4 local_a4;
  int local_a0;
  undefined4 local_9c;
  Rgba local_98 [3];
  Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> local_80 [2];
  Vec2<float> local_60;
  Header local_58 [60];
  int local_1c;
  int local_18;
  RgbaChannels local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar7 = std::operator<<((ostream *)&std::cout,"levelMode 1");
  poVar7 = std::operator<<(poVar7,", compression ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18);
  poVar7 = std::operator<<(poVar7,", tileSize ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1c);
  poVar7 = std::operator<<(poVar7,"x");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,in_stack_00000008);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_4::Header::Header
            (local_58,local_c,local_10,1.0,(Vec2 *)&local_60,1.0,INCREASING_Y,ZIP_COMPRESSION);
  puVar9 = (undefined4 *)Imf_3_4::Header::lineOrder();
  *puVar9 = 0;
  piVar10 = (int *)Imf_3_4::Header::compression();
  *piVar10 = local_18;
  Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::Array(local_80);
  poVar7 = std::operator<<((ostream *)&std::cout," writing");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  remove(local_8);
  pcVar1 = local_8;
  RVar6 = local_14;
  iVar3 = Imf_3_4::globalThreadCount();
  uVar16 = 0;
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)local_98,pcVar1,local_58,RVar6,local_1c,in_stack_00000008,
             MIPMAP_LEVELS,ROUND_DOWN,iVar3);
  local_9c = Imf_3_4::TiledRgbaOutputFile::numLevels();
  Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::resizeErase
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  for (local_a0 = 0; iVar5 = local_a0, iVar4 = Imf_3_4::TiledRgbaOutputFile::numLevels(),
      iVar5 < iVar4; local_a0 = local_a0 + 1) {
    local_a4 = Imf_3_4::TiledRgbaOutputFile::levelWidth((int)local_98);
    local_a8 = Imf_3_4::TiledRgbaOutputFile::levelHeight((int)local_98);
    Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
              ((Array2D<Imf_3_4::Rgba> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
    fillPixels(in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,iVar3);
    pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
    pRVar12 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_a0,0);
    Imf_3_4::TiledRgbaOutputFile::setFrameBuffer(local_98,(ulong)pRVar12,1);
    iVar5 = Imf_3_4::TiledRgbaOutputFile::numXTiles((int)local_98);
    iVar4 = Imf_3_4::TiledRgbaOutputFile::numYTiles((int)local_98);
    Imf_3_4::TiledRgbaOutputFile::writeTiles((int)local_98,0,iVar5 + -1,0,iVar4 + -1);
  }
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_98);
  poVar7 = std::operator<<((ostream *)&std::cout," reading");
  std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
  pcVar1 = local_8;
  iVar5 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)local_e0,pcVar1,iVar5);
  local_e8 = (int *)Imf_3_4::TiledRgbaInputFile::dataWindow();
  local_ec = *local_e8;
  local_f0 = local_e8[1];
  local_f4 = Imf_3_4::TiledRgbaInputFile::numLevels();
  Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::Array
            ((Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),in_stack_fffffffffffffd28
            );
  for (local_10c = 0; local_10c < local_f4; local_10c = local_10c + 1) {
    local_110 = Imf_3_4::TiledRgbaInputFile::levelWidth((int)local_e0);
    local_114 = Imf_3_4::TiledRgbaInputFile::levelHeight((int)local_e0);
    Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
    Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase
              ((Array2D<Imf_3_4::Rgba> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
    pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
    pRVar12 = Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_10c,(long)-local_f0);
    Imf_3_4::TiledRgbaInputFile::setFrameBuffer(local_e0,(ulong)(pRVar12 + -local_ec),1);
    iVar5 = Imf_3_4::TiledRgbaInputFile::numXTiles((int)local_e0);
    iVar4 = Imf_3_4::TiledRgbaInputFile::numYTiles((int)local_e0);
    Imf_3_4::TiledRgbaInputFile::readTiles((int)local_e0,0,iVar5 + -1,0,iVar4 + -1);
  }
  poVar7 = std::operator<<((ostream *)&std::cout," comparing");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::flush<char,std::char_traits<char>>);
  Imf_3_4::TiledRgbaInputFile::displayWindow();
  Imf_3_4::Header::displayWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffce0,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcdc,iVar3));
  if (!bVar2) {
    __assert_fail("in.displayWindow () == header.displayWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x103,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::dataWindow();
  Imf_3_4::Header::dataWindow();
  bVar2 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_fffffffffffffce0,
                     (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffcdc,iVar3));
  if (!bVar2) {
    __assert_fail("in.dataWindow () == header.dataWindow ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x104,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar14 = (float)Imf_3_4::TiledRgbaInputFile::pixelAspectRatio();
  pfVar13 = (float *)Imf_3_4::Header::pixelAspectRatio();
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in.pixelAspectRatio () == header.pixelAspectRatio ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x105,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  Imf_3_4::TiledRgbaInputFile::screenWindowCenter();
  v = (Vec2<float> *)Imf_3_4::Header::screenWindowCenter();
  bVar2 = Imath_3_2::Vec2<float>::operator==(&local_11c,v);
  if (!bVar2) {
    __assert_fail("in.screenWindowCenter () == header.screenWindowCenter ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x106,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  fVar14 = (float)Imf_3_4::TiledRgbaInputFile::screenWindowWidth();
  pfVar13 = (float *)Imf_3_4::Header::screenWindowWidth();
  if ((fVar14 != *pfVar13) || (NAN(fVar14) || NAN(*pfVar13))) {
    __assert_fail("in.screenWindowWidth () == header.screenWindowWidth ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x107,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  iVar3 = Imf_3_4::TiledRgbaInputFile::lineOrder();
  piVar10 = (int *)Imf_3_4::Header::lineOrder();
  if (iVar3 != *piVar10) {
    __assert_fail("in.lineOrder () == header.lineOrder ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x108,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  iVar3 = Imf_3_4::TiledRgbaInputFile::compression();
  piVar10 = (int *)Imf_3_4::Header::compression();
  if (iVar3 != *piVar10) {
    __assert_fail("in.compression () == header.compression ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x109,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  RVar6 = Imf_3_4::TiledRgbaInputFile::channels();
  if (RVar6 != local_14) {
    __assert_fail("in.channels () == channels",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                  ,0x10a,
                  "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                 );
  }
  local_120 = 0;
  do {
    if (local_f4 <= local_120) {
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::~Array
                ((Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)local_e0);
      remove(local_8);
      Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_>::~Array
                ((Array<Imf_3_4::Array2D<Imf_3_4::Rgba>_> *)
                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0));
      Imf_3_4::Header::~Header(local_58);
      return;
    }
    for (local_124 = 0; iVar3 = Imf_3_4::TiledRgbaInputFile::levelHeight((int)local_e0),
        local_124 < iVar3; local_124 = local_124 + 1) {
      for (local_128 = 0; iVar3 = Imf_3_4::TiledRgbaInputFile::levelWidth((int)local_e0),
          local_128 < iVar3; local_128 = local_128 + 1) {
        if ((local_14 & WRITE_R) == 0) {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != 0.0) || (NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x].r == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x115,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        else {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar15 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
            __assert_fail("(levels2[l])[y][x].r == (levels[l])[y][x].r",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x113,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        if ((local_14 & WRITE_G) == 0) {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != 0.0) || (NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x].g == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x11a,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        else {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar15 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
            __assert_fail("(levels2[l])[y][x].g == (levels[l])[y][x].g",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x118,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        if ((local_14 & WRITE_B) == 0) {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != 0.0) || (NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x].b == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x11f,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        else {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar15 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != fVar15) || (NAN(fVar14) || NAN(fVar15))) {
            __assert_fail("(levels2[l])[y][x].b == (levels[l])[y][x].b",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x11d,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        if ((local_14 & WRITE_A) == 0) {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((fVar14 != 1.0) || (NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x].a == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x124,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
        else {
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_(local_108);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          in_stack_fffffffffffffcf4 =
               Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          pAVar11 = Imf_3_4::Array::operator_cast_to_Array2D_((Array *)local_80);
          Imf_3_4::Array2D<Imf_3_4::Rgba>::operator[](pAVar11 + local_120,(long)local_124);
          fVar14 = Imath_3_2::half::operator_cast_to_float
                             ((half *)CONCAT44(in_stack_fffffffffffffcd4,uVar16));
          if ((in_stack_fffffffffffffcf4 != fVar14) ||
             (NAN(in_stack_fffffffffffffcf4) || NAN(fVar14))) {
            __assert_fail("(levels2[l])[y][x].a == (levels[l])[y][x].a",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testTiledRgba.cpp"
                          ,0x122,
                          "void (anonymous namespace)::writeReadRGBAMIP(const char *, int, int, RgbaChannels, Compression, int, int)"
                         );
          }
        }
      }
    }
    local_120 = local_120 + 1;
  } while( true );
}

Assistant:

void
writeReadRGBAMIP (
    const char   fileName[],
    int          width,
    int          height,
    RgbaChannels channels,
    Compression  comp,
    int          xSize,
    int          ySize)
{
    cout << "levelMode 1"
         << ", compression " << comp << ", tileSize " << xSize << "x" << ySize
         << endl;

    Header header (width, height);
    header.lineOrder ()   = INCREASING_Y;
    header.compression () = comp;

    Array<Array2D<Rgba>> levels;

    {
        cout << " writing" << flush;

        remove (fileName);
        TiledRgbaOutputFile out (
            fileName,
            header,
            channels,
            xSize,
            ySize,
            MIPMAP_LEVELS,
            ROUND_DOWN);

        int numLevels = out.numLevels ();
        levels.resizeErase (numLevels);

        for (int level = 0; level < out.numLevels (); ++level)
        {
            int levelWidth  = out.levelWidth (level);
            int levelHeight = out.levelHeight (level);
            levels[level].resizeErase (levelHeight, levelWidth);
            fillPixels (levels[level], levelWidth, levelHeight);

            out.setFrameBuffer (&(levels[level])[0][0], 1, levelWidth);
            out.writeTiles (
                0,
                out.numXTiles (level) - 1,
                0,
                out.numYTiles (level) - 1,
                level);
        }
    }

    {
        cout << " reading" << flush;

        TiledRgbaInputFile in (fileName);
        const Box2i&       dw  = in.dataWindow ();
        int                dwx = dw.min.x;
        int                dwy = dw.min.y;

        int                  numLevels = in.numLevels ();
        Array<Array2D<Rgba>> levels2 (numLevels);

        for (int level = 0; level < numLevels; ++level)
        {
            int levelWidth  = in.levelWidth (level);
            int levelHeight = in.levelHeight (level);
            levels2[level].resizeErase (levelHeight, levelWidth);

            in.setFrameBuffer (&(levels2[level])[-dwy][-dwx], 1, levelWidth);
            in.readTiles (
                0,
                in.numXTiles (level) - 1,
                0,
                in.numYTiles (level) - 1,
                level);
        }

        cout << " comparing" << endl << flush;

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        for (int l = 0; l < numLevels; ++l)
        {
            for (int y = 0; y < in.levelHeight (l); ++y)
            {
                for (int x = 0; x < in.levelWidth (l); ++x)
                {
                    if (channels & WRITE_R)
                        assert ((levels2[l])[y][x].r == (levels[l])[y][x].r);
                    else
                        assert ((levels2[l])[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert ((levels2[l])[y][x].g == (levels[l])[y][x].g);
                    else
                        assert ((levels2[l])[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert ((levels2[l])[y][x].b == (levels[l])[y][x].b);
                    else
                        assert ((levels2[l])[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert ((levels2[l])[y][x].a == (levels[l])[y][x].a);
                    else
                        assert ((levels2[l])[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}